

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::updatePose(btSoftBody *this)

{
  btMatrix3x3 *a_00;
  btVector3 *pbVar1;
  btVector3 *pbVar2;
  long in_RDI;
  btScalar bVar3;
  btScalar idet;
  btMatrix3x3 s;
  btMatrix3x3 r;
  btVector3 *b;
  btVector3 a;
  int ni;
  int i;
  btScalar eps;
  btMatrix3x3 Apq;
  btVector3 com;
  Pose *pose;
  btVector3 *in_stack_fffffffffffffdc8;
  btMatrix3x3 *in_stack_fffffffffffffdd0;
  btMatrix3x3 *in_stack_fffffffffffffdd8;
  btMatrix3x3 *in_stack_fffffffffffffde0;
  btScalar b_00;
  btSoftBody *in_stack_fffffffffffffe00;
  btScalar in_stack_fffffffffffffe30;
  float in_stack_fffffffffffffe34;
  float local_1c8;
  float local_1c4;
  btMatrix3x3 *in_stack_fffffffffffffe68;
  btMatrix3x3 *in_stack_fffffffffffffe70;
  btMatrix3x3 local_160 [2];
  btMatrix3x3 local_100;
  btVector3 local_d0;
  btVector3 local_c0;
  btVector3 local_b0;
  btVector3 *local_a0;
  btScalar local_98 [4];
  undefined1 local_88 [44];
  undefined8 local_5c;
  undefined4 local_54;
  btMatrix3x3 local_50;
  undefined1 local_20 [16];
  long local_10;
  
  if ((*(byte *)(in_RDI + 0x259) & 1) != 0) {
    local_10 = in_RDI + 600;
    local_20 = (undefined1  [16])evaluateCom(in_stack_fffffffffffffe00);
    *(undefined8 *)(local_10 + 0x48) = local_20._0_8_;
    *(undefined8 *)(local_10 + 0x50) = local_20._8_8_;
    btMatrix3x3::btMatrix3x3(in_stack_fffffffffffffde0);
    local_54 = 0x34000000;
    local_88._32_4_ = 0.0;
    local_88._28_4_ = 0.0;
    local_88._24_4_ = 0.0;
    btVector3::btVector3
              ((btVector3 *)(local_88 + 0x24),(btScalar *)(local_88 + 0x20),
               (btScalar *)(local_88 + 0x1c),(btScalar *)(local_88 + 0x18));
    a_00 = (btMatrix3x3 *)btMatrix3x3::operator[](&local_50,2);
    *(undefined8 *)a_00->m_el[0].m_floats = local_88._36_8_;
    *(undefined8 *)(a_00->m_el[0].m_floats + 2) = local_5c;
    pbVar1 = btMatrix3x3::operator[](&local_50,1);
    *(undefined8 *)pbVar1->m_floats = *(undefined8 *)a_00->m_el[0].m_floats;
    *(undefined8 *)(pbVar1->m_floats + 2) = *(undefined8 *)(a_00->m_el[0].m_floats + 2);
    pbVar2 = btMatrix3x3::operator[](&local_50,0);
    *(undefined8 *)pbVar2->m_floats = *(undefined8 *)pbVar1->m_floats;
    *(undefined8 *)(pbVar2->m_floats + 2) = *(undefined8 *)(pbVar1->m_floats + 2);
    pbVar1 = btMatrix3x3::operator[](&local_50,0);
    btVector3::setX(pbVar1,1.1920929e-07);
    pbVar1 = btMatrix3x3::operator[](&local_50,1);
    btVector3::setY(pbVar1,2.3841858e-07);
    pbVar1 = btMatrix3x3::operator[](&local_50,2);
    btVector3::setZ(pbVar1,3.5762787e-07);
    local_88._20_4_ = 0.0;
    local_88._16_4_ =
         btAlignedObjectArray<btSoftBody::Node>::size
                   ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
    for (; (int)local_88._20_4_ < (int)local_88._16_4_; local_88._20_4_ = local_88._20_4_ + 1) {
      in_stack_fffffffffffffdd0 =
           (btMatrix3x3 *)
           btAlignedObjectArray<float>::operator[]
                     ((btAlignedObjectArray<float> *)(local_10 + 0x28),local_88._20_4_);
      btAlignedObjectArray<btSoftBody::Node>::operator[]
                ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_88._20_4_);
      local_98 = (btScalar  [4])
                 operator-(in_stack_fffffffffffffde0->m_el,in_stack_fffffffffffffdd8->m_el);
      local_88._0_16_ =
           (undefined1  [16])
           ::operator*((btScalar *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      local_a0 = btAlignedObjectArray<btVector3>::operator[]
                           ((btAlignedObjectArray<btVector3> *)(local_10 + 8),local_88._20_4_);
      in_stack_fffffffffffffde0 = (btMatrix3x3 *)local_88;
      btVector3::x((btVector3 *)in_stack_fffffffffffffde0);
      local_b0 = ::operator*((btScalar *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      in_stack_fffffffffffffdd8 = &local_50;
      pbVar1 = btMatrix3x3::operator[](in_stack_fffffffffffffdd8,0);
      btVector3::operator+=(pbVar1,&local_b0);
      btVector3::y(in_stack_fffffffffffffde0->m_el);
      local_c0 = ::operator*((btScalar *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      pbVar1 = btMatrix3x3::operator[](in_stack_fffffffffffffdd8,1);
      btVector3::operator+=(pbVar1,&local_c0);
      btVector3::z(in_stack_fffffffffffffde0->m_el);
      local_d0 = ::operator*((btScalar *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      pbVar1 = btMatrix3x3::operator[](&local_50,2);
      btVector3::operator+=(pbVar1,&local_d0);
    }
    btMatrix3x3::btMatrix3x3(in_stack_fffffffffffffde0);
    btMatrix3x3::btMatrix3x3(in_stack_fffffffffffffde0);
    PolarDecompose(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    btMatrix3x3::operator=((btMatrix3x3 *)(local_10 + 0x58),&local_100);
    btMatrix3x3::transpose
              ((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    ::operator*(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    ::operator*(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    btMatrix3x3::operator=((btMatrix3x3 *)(local_10 + 0x88),local_160);
    if (1.0 < *(float *)(in_RDI + 0x1c4)) {
      bVar3 = btMatrix3x3::determinant(in_stack_fffffffffffffde0);
      b_00 = (btScalar)((ulong)in_stack_fffffffffffffde0 >> 0x20);
      local_1c8 = 1.0 / bVar3;
      local_1c4 = Clamp<float>(&local_1c8,(float *)&stack0xfffffffffffffe34,
                               (float *)(in_RDI + 0x1c4));
      Mul(a_00,b_00);
      btMatrix3x3::operator=
                ((btMatrix3x3 *)(local_10 + 0x88),(btMatrix3x3 *)&stack0xfffffffffffffe04);
    }
  }
  return;
}

Assistant:

void					btSoftBody::updatePose()
{
	if(m_pose.m_bframe)
	{
		btSoftBody::Pose&	pose=m_pose;
		const btVector3		com=evaluateCom();
		/* Com			*/ 
		pose.m_com	=	com;
		/* Rotation		*/ 
		btMatrix3x3		Apq;
		const btScalar	eps=SIMD_EPSILON;
		Apq[0]=Apq[1]=Apq[2]=btVector3(0,0,0);
		Apq[0].setX(eps);Apq[1].setY(eps*2);Apq[2].setZ(eps*3);
		for(int i=0,ni=m_nodes.size();i<ni;++i)
		{
			const btVector3		a=pose.m_wgh[i]*(m_nodes[i].m_x-com);
			const btVector3&	b=pose.m_pos[i];
			Apq[0]+=a.x()*b;
			Apq[1]+=a.y()*b;
			Apq[2]+=a.z()*b;
		}
		btMatrix3x3		r,s;
		PolarDecompose(Apq,r,s);
		pose.m_rot=r;
		pose.m_scl=pose.m_aqq*r.transpose()*Apq;
		if(m_cfg.maxvolume>1)
		{
			const btScalar	idet=Clamp<btScalar>(	1/pose.m_scl.determinant(),
				1,m_cfg.maxvolume);
			pose.m_scl=Mul(pose.m_scl,idet);
		}

	}
}